

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  int iVar4;
  short sVar5;
  char cVar6;
  int iVar7;
  BYTE *s;
  void *__s;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong *puVar21;
  int *piVar22;
  char cVar23;
  ulong uVar24;
  short *psVar25;
  long lVar26;
  short *psVar27;
  short *psVar28;
  long *__src;
  ulong uVar29;
  char *pcVar30;
  long *plVar31;
  ulong *puVar32;
  U16 *hashTable;
  int local_80;
  short *local_78;
  
  __s = malloc(0x4020);
  if (__s == (void *)0x0) {
    return 0;
  }
  if (((ulong)__s & 7) == 0) {
    memset(__s,0,0x4020);
  }
  uVar18 = *srcSizePtr;
  uVar29 = (ulong)uVar18;
  iVar7 = 0;
  if (uVar29 < 0x7e000001) {
    iVar7 = (uint)(uVar29 * 0x8080808081 >> 0x27) + 0x10;
  }
  if (targetDstSize < iVar7) {
    local_80 = (int)src;
    iVar20 = (int)dst;
    if ((int)uVar18 < 0x1000b) {
      iVar7 = 0;
      if (uVar18 < 0x7e000001) {
        if (uVar18 == 0) {
          iVar7 = 0;
          if (0 < targetDstSize) {
            *dst = '\0';
            *srcSizePtr = 0;
            iVar7 = 1;
          }
        }
        else if (0 < targetDstSize) {
          psVar28 = (short *)(dst + targetDstSize);
          *(uint *)((long)__s + 0x4018) = uVar18;
          *(uint *)((long)__s + 0x4010) = uVar18;
          *(undefined4 *)((long)__s + 0x4014) = 3;
          piVar22 = (int *)src;
          if (0xc < uVar18) {
            *(undefined2 *)((long)__s + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
            puVar2 = (ulong *)(src + (uVar29 - 0xc));
            local_78 = (short *)dst;
LAB_003abc77:
            iVar7 = *(int *)((long)piVar22 + 1);
            uVar18 = 0x40;
            uVar24 = 1;
            piVar14 = (int *)((long)piVar22 + 1);
            do {
              piVar13 = piVar14;
              piVar14 = (int *)(uVar24 + (long)piVar13);
              dst = (char *)local_78;
              if (src + (uVar29 - 0xb) < piVar14) goto LAB_003ab5b6;
              uVar24 = (ulong)(uVar18 >> 6);
              uVar18 = uVar18 + 1;
              uVar16 = (ulong)((uint)(iVar7 * -0x61c8864f) >> 0x13);
              uVar15 = (ulong)*(ushort *)((long)__s + uVar16 * 2);
              sVar5 = (short)src;
              iVar7 = *piVar14;
              *(short *)((long)__s + uVar16 * 2) = (short)piVar13 - sVar5;
            } while (*(int *)(src + uVar15) != *piVar13);
            iVar7 = (int)piVar13 - (int)piVar22;
            lVar12 = 0;
            uVar18 = iVar7 - 0xfU;
            cVar6 = (char)piVar13 * '\x10' + (char)piVar22 * -0x10;
            do {
              cVar23 = cVar6;
              uVar19 = uVar18;
              lVar26 = lVar12;
              pcVar30 = src + lVar26 + uVar15;
              if ((pcVar30 <= src) || ((int *)(lVar26 + (long)piVar13) <= piVar22)) break;
              lVar12 = lVar26 + -1;
              uVar18 = uVar19 - 1;
              cVar6 = cVar23 + -0x10;
            } while (*(char *)((long)piVar13 + lVar26 + -1) == src[lVar26 + (uVar15 - 1)]);
            iVar17 = (int)lVar26;
            uVar24 = (ulong)(uint)(iVar17 + ((int)piVar13 - (int)piVar22));
            if ((short *)((long)local_78 + uVar24 + (ulong)(iVar7 + iVar17 + 0xf0) / 0xff + 0xc) <=
                psVar28) {
              psVar27 = (short *)((long)local_78 + 1);
              if ((uint)(iVar7 + iVar17) < 0xf) {
                *(char *)local_78 = cVar23;
              }
              else {
                uVar15 = (ulong)(iVar7 - 0xfU) + lVar26;
                *(char *)local_78 = -0x10;
                if (0xfe < (int)uVar15) {
                  uVar18 = 0x1fd;
                  if (uVar19 < 0x1fd) {
                    uVar18 = uVar19;
                  }
                  if (0x1fc < (int)uVar19) {
                    uVar19 = 0x1fd;
                  }
                  memset(psVar27,0xff,(ulong)((((iVar7 + 0xef) - uVar18) + iVar17) / 0xff + 1));
                  uVar18 = ((iVar7 + 0xef) - uVar19) + iVar17;
                  psVar27 = (short *)((long)local_78 + (ulong)uVar18 / 0xff + 2);
                  uVar15 = (ulong)(iVar7 + -0x10e + iVar17 + uVar18 / 0xff);
                }
                *(char *)psVar27 = (char)uVar15;
                psVar27 = (short *)((long)psVar27 + 1);
              }
              psVar25 = (short *)(uVar24 + (long)psVar27);
              piVar14 = piVar22;
              do {
                *(undefined8 *)psVar27 = *(undefined8 *)piVar14;
                psVar27 = psVar27 + 4;
                piVar14 = piVar14 + 2;
              } while (psVar27 < psVar25);
              piVar14 = (int *)(lVar26 + (long)piVar13);
              if ((short *)((long)psVar25 + 0xb) <= psVar28) {
                do {
                  *psVar25 = (short)piVar14 - (short)pcVar30;
                  puVar1 = (ulong *)(piVar14 + 1);
                  puVar21 = (ulong *)(pcVar30 + 4);
                  puVar32 = puVar1;
                  if (puVar1 < puVar2) {
                    if (*puVar21 == *puVar1) {
                      puVar21 = (ulong *)(pcVar30 + 0xc);
                      puVar32 = (ulong *)(piVar14 + 3);
                      goto LAB_003abe8e;
                    }
                    uVar24 = *puVar1 ^ *puVar21;
                    lVar12 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                      }
                    }
                    uVar18 = (uint)lVar12 >> 3;
                  }
                  else {
LAB_003abe8e:
                    if (puVar32 < puVar2) {
                      iVar7 = ((int)puVar32 - (int)piVar14) + -4;
LAB_003abe9e:
                      if (*puVar21 == *puVar32) goto code_r0x003abea9;
                      uVar15 = *puVar32 ^ *puVar21;
                      uVar24 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                        }
                      }
                      uVar18 = ((uint)(uVar24 >> 3) & 0x1fffffff) + iVar7;
                      goto LAB_003abf21;
                    }
LAB_003abeb9:
                    if ((puVar32 < src + (uVar29 - 8)) && ((int)*puVar21 == (int)*puVar32)) {
                      puVar32 = (ulong *)((long)puVar32 + 4);
                      puVar21 = (ulong *)((long)puVar21 + 4);
                    }
                    if ((puVar32 < src + (uVar29 - 6)) && ((short)*puVar21 == (short)*puVar32)) {
                      puVar32 = (ulong *)((long)puVar32 + 2);
                      puVar21 = (ulong *)((long)puVar21 + 2);
                    }
                    if (puVar32 < src + (uVar29 - 5)) {
                      puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar21 == (char)*puVar32))
                      ;
                    }
                    uVar18 = (int)puVar32 - (int)puVar1;
                  }
LAB_003abf21:
                  dst = (char *)(psVar25 + 1);
                  piVar22 = (int *)((long)piVar14 + (ulong)uVar18 + 4);
                  uVar19 = uVar18;
                  if (psVar28 < (short *)((long)psVar25 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) {
                    uVar19 = ((int)psVar28 - (int)dst) * 0xff - 0x5ec;
                    piVar22 = (int *)((long)piVar22 - (ulong)(uVar18 - uVar19));
                    for (piVar14 = piVar22; piVar14 <= piVar13; piVar14 = (int *)((long)piVar14 + 1)
                        ) {
                      *(undefined2 *)
                       ((long)__s + (ulong)((uint)(*piVar14 * -0x61c8864f) >> 0x13) * 2) = 0;
                    }
                  }
                  if (uVar19 < 0xf) {
                    *(char *)local_78 = (char)*local_78 + (char)uVar19;
                  }
                  else {
                    *(char *)local_78 = (char)*local_78 + '\x0f';
                    uVar18 = uVar19 - 0xf;
                    *(short *)((long)dst + 0) = -1;
                    *(short *)((long)dst + 2) = -1;
                    if (0x3fb < uVar18) {
                      uVar24 = (ulong)(((uVar19 - 0x40b) / 0x3fc) * 4);
                      memset(psVar25 + 3,0xff,uVar24 + 4);
                      uVar18 = (uVar19 - 0x40b) % 0x3fc;
                      dst = (char *)((long)psVar25 + uVar24 + 6);
                    }
                    uVar19 = (uVar18 & 0xffff) / 0xff;
                    pcVar30 = (char *)((long)dst + (ulong)uVar19);
                    dst = pcVar30 + 1;
                    *pcVar30 = (char)uVar19 + (char)uVar18;
                  }
                  if (src + (uVar29 - 0xb) <= piVar22) break;
                  *(short *)((long)__s +
                            (ulong)((uint)(*(int *)((long)piVar22 + -2) * -0x61c8864f) >> 0x13) * 2)
                       = ((short)piVar22 + -2) - sVar5;
                  uVar24 = (ulong)((uint)(*piVar22 * -0x61c8864f) >> 0x13);
                  uVar3 = *(ushort *)((long)__s + uVar24 * 2);
                  pcVar30 = src + uVar3;
                  *(short *)((long)__s + uVar24 * 2) = (short)piVar22 - sVar5;
                  local_78 = (short *)dst;
                  if (*(int *)(src + uVar3) != *piVar22) goto LAB_003abc77;
                  psVar25 = (short *)((long)dst + 1);
                  *dst = '\0';
                  piVar14 = piVar22;
                  if (psVar28 < (short *)((long)dst + 0xc)) break;
                } while( true );
              }
            }
          }
LAB_003ab5b6:
          pcVar30 = src + (uVar29 - (long)piVar22);
          if (psVar28 < (short *)((long)dst + (long)(pcVar30 + (ulong)(pcVar30 + 0xf0) / 0xff + 1)))
          {
            pcVar30 = (char *)((long)psVar28 +
                              (~(ulong)dst - ((ulong)((long)psVar28 + ~(ulong)dst + 0xf1) >> 8)));
          }
          if (pcVar30 < (char *)0xf) {
            *dst = (char)pcVar30 << 4;
          }
          else {
            pcVar8 = pcVar30 + -0xf;
            *dst = -0x10;
            psVar28 = (short *)((long)dst + 1);
            if ((char *)0xfe < pcVar8) {
              uVar29 = (ulong)(pcVar30 + -0x10e) / 0xff;
              memset(psVar28,0xff,uVar29 + 1);
              psVar28 = (short *)((long)dst + uVar29 + 2);
              pcVar8 = pcVar30 + uVar29 * -0xff + -0x10e;
            }
            *(char *)psVar28 = (char)pcVar8;
            dst = (char *)psVar28;
          }
          memcpy((char *)((long)dst + 1),piVar22,(size_t)pcVar30);
          *srcSizePtr = ((int)piVar22 + (int)pcVar30) - local_80;
          iVar7 = ((int)(char *)((long)dst + 1) + (int)pcVar30) - iVar20;
        }
      }
    }
    else {
      iVar7 = 0;
      if ((uVar18 < 0x7e000001) && (0 < targetDstSize)) {
        plVar9 = (long *)(src + (uVar29 - 0xb));
        psVar28 = (short *)(dst + targetDstSize);
        *(uint *)((long)__s + 0x4018) = uVar18;
        *(uint *)((long)__s + 0x4010) = uVar18;
        *(undefined4 *)((long)__s + 0x4014) = 2;
        *(undefined4 *)((long)__s + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = 0;
        plVar11 = (long *)(src + 2);
        puVar2 = (ulong *)(src + (uVar29 - 0xc));
        __src = (long *)src;
LAB_003ab71a:
        lVar12 = *(long *)((long)__src + 1);
        uVar24 = 1;
        plVar31 = (long *)((long)__src + 1);
        uVar18 = 0x41;
        while( true ) {
          plVar10 = plVar11;
          uVar15 = (ulong)(lVar12 * -0x30e4432345000000) >> 0x34;
          uVar19 = *(uint *)((long)__s + uVar15 * 4);
          uVar16 = (ulong)uVar19;
          iVar7 = (int)plVar31;
          lVar12 = *plVar10;
          *(int *)((long)__s + uVar15 * 4) = iVar7 - local_80;
          if (((uint)(iVar7 - local_80) <= uVar19 + 0xffff) &&
             (*(int *)(src + uVar16) == (int)*plVar31)) break;
          plVar11 = (long *)(uVar24 + (long)plVar10);
          uVar24 = (ulong)(uVar18 >> 6);
          plVar31 = plVar10;
          uVar18 = uVar18 + 1;
          if (plVar9 < plVar11) goto LAB_003ac120;
        }
        iVar17 = iVar7 - (int)__src;
        lVar12 = 0;
        cVar6 = (char)plVar31 * '\x10' + (char)__src * -0x10;
        uVar18 = iVar17 - 0xfU;
        do {
          uVar19 = uVar18;
          cVar23 = cVar6;
          lVar26 = lVar12;
          piVar22 = (int *)(src + lVar26 + uVar16);
          plVar11 = (long *)(lVar26 + (long)plVar31);
          if ((piVar22 <= src) || (plVar11 <= __src)) break;
          lVar12 = lVar26 + -1;
          cVar6 = cVar23 + -0x10;
          uVar18 = uVar19 - 1;
        } while (*(char *)((long)plVar31 + lVar26 + -1) == src[lVar26 + (uVar16 - 1)]);
        iVar4 = (int)lVar26;
        uVar24 = (ulong)(uint)(iVar4 + (iVar7 - (int)__src));
        if ((short *)((long)dst + uVar24 + (ulong)(iVar17 + iVar4 + 0xf0) / 0xff + 0xc) <= psVar28)
        {
          pcVar30 = (char *)((long)dst + 1);
          if ((uint)(iVar17 + iVar4) < 0xf) {
            *dst = cVar23;
          }
          else {
            uVar15 = (ulong)(iVar17 - 0xfU) + lVar26;
            *dst = -0x10;
            if (0xfe < (int)uVar15) {
              uVar18 = 0x1fd;
              if (uVar19 < 0x1fd) {
                uVar18 = uVar19;
              }
              if (0x1fc < (int)uVar19) {
                uVar19 = 0x1fd;
              }
              memset(pcVar30,0xff,(ulong)((((iVar17 + 0xef) - uVar18) + iVar4) / 0xff + 1));
              uVar18 = ((iVar17 + 0xef) - uVar19) + iVar4;
              pcVar30 = (char *)((long)dst + (ulong)uVar18 / 0xff + 2);
              uVar15 = (ulong)(iVar17 + -0x10e + iVar4 + uVar18 / 0xff);
            }
            *pcVar30 = (char)uVar15;
            pcVar30 = pcVar30 + 1;
          }
          psVar27 = (short *)(pcVar30 + uVar24);
          lVar12 = 0;
          do {
            pcVar8 = pcVar30 + lVar12;
            *(undefined8 *)pcVar8 = *(undefined8 *)((long)__src + lVar12);
            lVar12 = lVar12 + 8;
          } while (pcVar8 + 8 < psVar27);
          psVar25 = (short *)dst;
          if ((short *)((long)psVar27 + 0xb) <= psVar28) {
            do {
              *psVar27 = (short)plVar11 - (short)piVar22;
              puVar1 = (ulong *)((long)plVar11 + 4);
              puVar21 = (ulong *)(piVar22 + 1);
              puVar32 = puVar1;
              if (puVar1 < puVar2) {
                if (*puVar21 == *puVar1) {
                  puVar21 = (ulong *)(piVar22 + 3);
                  puVar32 = (ulong *)((long)plVar11 + 0xc);
                  goto LAB_003ab961;
                }
                uVar24 = *puVar1 ^ *puVar21;
                lVar12 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                uVar18 = (uint)lVar12 >> 3;
              }
              else {
LAB_003ab961:
                if (puVar32 < puVar2) {
                  iVar7 = ((int)puVar32 - (int)plVar11) + -4;
LAB_003ab972:
                  if (*puVar21 == *puVar32) goto code_r0x003ab97d;
                  uVar15 = *puVar32 ^ *puVar21;
                  uVar24 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  uVar18 = ((uint)(uVar24 >> 3) & 0x1fffffff) + iVar7;
                  goto LAB_003ab9f5;
                }
LAB_003ab98d:
                if ((puVar32 < src + (uVar29 - 8)) && ((int)*puVar21 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar21 = (ulong *)((long)puVar21 + 4);
                }
                if ((puVar32 < src + (uVar29 - 6)) && ((short)*puVar21 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar21 = (ulong *)((long)puVar21 + 2);
                }
                if (puVar32 < src + (uVar29 - 5)) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar21 == (char)*puVar32));
                }
                uVar18 = (int)puVar32 - (int)puVar1;
              }
LAB_003ab9f5:
              dst = (char *)(psVar27 + 1);
              __src = (long *)((long)plVar11 + (ulong)uVar18 + 4);
              uVar19 = uVar18;
              if (psVar28 < (short *)((long)psVar27 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) {
                uVar19 = ((int)psVar28 - (int)dst) * 0xff - 0x5ec;
                __src = (long *)((long)__src - (ulong)(uVar18 - uVar19));
                for (plVar11 = __src; plVar11 <= plVar31; plVar11 = (long *)((long)plVar11 + 1)) {
                  *(undefined4 *)((long)__s + ((ulong)(*plVar11 * -0x30e4432345000000) >> 0x34) * 4)
                       = 0;
                }
              }
              if (uVar19 < 0xf) {
                *(char *)psVar25 = (char)*psVar25 + (char)uVar19;
              }
              else {
                *(char *)psVar25 = (char)*psVar25 + '\x0f';
                uVar18 = uVar19 - 0xf;
                *(short *)((long)dst + 0) = -1;
                *(short *)((long)dst + 2) = -1;
                if (0x3fb < uVar18) {
                  uVar24 = (ulong)(((uVar19 - 0x40b) / 0x3fc) * 4);
                  memset(psVar27 + 3,0xff,uVar24 + 4);
                  uVar18 = (uVar19 - 0x40b) % 0x3fc;
                  dst = (char *)((long)psVar27 + uVar24 + 6);
                }
                uVar19 = (uVar18 & 0xffff) / 0xff;
                pcVar30 = (char *)((long)dst + (ulong)uVar19);
                dst = pcVar30 + 1;
                *pcVar30 = (char)uVar19 + (char)uVar18;
              }
              if (plVar9 <= __src) break;
              *(int *)((long)__s +
                      ((ulong)(*(long *)((long)__src + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)__src + -2) - local_80;
              uVar24 = (ulong)(*__src * -0x30e4432345000000) >> 0x34;
              uVar19 = (int)__src - local_80;
              uVar18 = *(uint *)((long)__s + uVar24 * 4);
              *(uint *)((long)__s + uVar24 * 4) = uVar19;
              if ((uVar18 + 0xffff < uVar19) ||
                 (piVar22 = (int *)(src + uVar18), *piVar22 != (int)*__src)) goto LAB_003abbcf;
              psVar27 = (short *)((long)dst + 1);
              *dst = '\0';
              plVar11 = __src;
              psVar25 = (short *)dst;
              if (psVar28 < (short *)((long)dst + 0xc)) break;
            } while( true );
          }
        }
        goto LAB_003ac120;
      }
    }
  }
  else {
    iVar7 = LZ4_compress_fast_extState(__s,src,dst,uVar18,targetDstSize,1);
  }
LAB_003ac218:
  free(__s);
  return iVar7;
code_r0x003ab97d:
  puVar32 = puVar32 + 1;
  puVar21 = puVar21 + 1;
  iVar7 = iVar7 + 8;
  if (puVar2 <= puVar32) goto LAB_003ab98d;
  goto LAB_003ab972;
LAB_003abbcf:
  plVar11 = (long *)((long)__src + 2);
  if (plVar9 < plVar11) goto LAB_003ac120;
  goto LAB_003ab71a;
LAB_003ac120:
  pcVar30 = src + (uVar29 - (long)__src);
  if (psVar28 < (short *)((long)dst + (long)(pcVar30 + (ulong)(pcVar30 + 0xf0) / 0xff + 1))) {
    pcVar30 = (char *)((long)psVar28 +
                      (~(ulong)dst - ((ulong)((long)psVar28 + ~(ulong)dst + 0xf1) >> 8)));
  }
  if (pcVar30 < (char *)0xf) {
    *dst = (char)pcVar30 << 4;
  }
  else {
    pcVar8 = pcVar30 + -0xf;
    *dst = -0x10;
    psVar28 = (short *)((long)dst + 1);
    if ((char *)0xfe < pcVar8) {
      uVar29 = (ulong)(pcVar30 + -0x10e) / 0xff;
      memset(psVar28,0xff,uVar29 + 1);
      psVar28 = (short *)((long)dst + uVar29 + 2);
      pcVar8 = pcVar30 + uVar29 * -0xff + -0x10e;
    }
    *(char *)psVar28 = (char)pcVar8;
    dst = (char *)psVar28;
  }
  memcpy((char *)((long)dst + 1),__src,(size_t)pcVar30);
  *srcSizePtr = ((int)__src + (int)pcVar30) - local_80;
  iVar7 = ((int)(char *)((long)dst + 1) + (int)pcVar30) - iVar20;
  goto LAB_003ac218;
code_r0x003abea9:
  puVar32 = puVar32 + 1;
  puVar21 = puVar21 + 1;
  iVar7 = iVar7 + 8;
  if (puVar2 <= puVar32) goto LAB_003abeb9;
  goto LAB_003abe9e;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}